

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

int lre_exec(uint8_t **capture,uint8_t *bc_buf,uint8_t *cbuf,int cindex,int clen,int cbuf_type,
            void *opaque)

{
  byte bVar1;
  byte bVar2;
  undefined8 opaque_00;
  size_t ptr;
  intptr_t iVar3;
  long lVar4;
  long lVar5;
  undefined8 uStack_80;
  BOOL aBStack_78 [2];
  uint8_t *puStack_70;
  undefined1 local_68 [8];
  REExecContext s_s;
  
  bVar1 = *bc_buf;
  s_s.capture_count = bVar1 >> 2 & 1;
  s_s.stack_size_max = bVar1 >> 1 & 1;
  s_s.multi_line = bVar1 >> 4 & 1;
  s_s.cbuf_end._4_4_ = (uint)bc_buf[1];
  bVar2 = bc_buf[2];
  s_s.cbuf_type = (uint)bVar2;
  local_68 = (undefined1  [8])cbuf;
  puStack_70 = (uint8_t *)0x2;
  s_s.cbuf_end._0_4_ = 2;
  if ((bVar1 >> 4 & 1) == 0) {
    s_s.cbuf_end._0_4_ = cbuf_type;
  }
  s_s.cbuf = cbuf + (clen << ((byte)cbuf_type & 0x1f));
  if (cbuf_type != 1) {
    s_s.cbuf_end._0_4_ = cbuf_type;
  }
  s_s._32_8_ = opaque;
  lVar4 = (ulong)bc_buf[1] * 0x10;
  s_s.opaque = (void *)(lVar4 + (ulong)bVar2 * 8 + 0x20);
  s_s.state_size = 0;
  s_s.state_stack = (uint8_t *)0x0;
  s_s.state_stack_size = 0;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 8) {
    *(undefined8 *)((long)capture + lVar5) = 0;
  }
  lVar4 = -(ulong)((uint)bVar2 * 8 + 0xf & 0xfffffff0);
  *(undefined4 *)((long)aBStack_78 + lVar4) = 0;
  *(undefined8 *)((long)&uStack_80 + lVar4) = 0x15e25a;
  iVar3 = lre_exec_backtrack((REExecContext *)local_68,capture,(StackInt *)(local_68 + lVar4),0,
                             bc_buf + 7,cbuf + (cindex << ((byte)cbuf_type & 0x1f)),
                             *(BOOL *)((long)aBStack_78 + lVar4));
  ptr = s_s.state_size;
  opaque_00 = s_s._32_8_;
  *(undefined8 *)((long)&puStack_70 + lVar4) = 0x15e26e;
  lre_realloc((void *)opaque_00,(void *)ptr,0);
  return (int)iVar3;
}

Assistant:

int lre_exec(uint8_t **capture,
             const uint8_t *bc_buf, const uint8_t *cbuf, int cindex, int clen,
             int cbuf_type, void *opaque)
{
    REExecContext s_s, *s = &s_s;
    int re_flags, i, alloca_size, ret;
    StackInt *stack_buf;
    
    re_flags = bc_buf[RE_HEADER_FLAGS];
    s->multi_line = (re_flags & LRE_FLAG_MULTILINE) != 0;
    s->ignore_case = (re_flags & LRE_FLAG_IGNORECASE) != 0;
    s->is_utf16 = (re_flags & LRE_FLAG_UTF16) != 0;
    s->capture_count = bc_buf[RE_HEADER_CAPTURE_COUNT];
    s->stack_size_max = bc_buf[RE_HEADER_STACK_SIZE];
    s->cbuf = cbuf;
    s->cbuf_end = cbuf + (clen << cbuf_type);
    s->cbuf_type = cbuf_type;
    if (s->cbuf_type == 1 && s->is_utf16)
        s->cbuf_type = 2;
    s->opaque = opaque;

    s->state_size = sizeof(REExecState) +
        s->capture_count * sizeof(capture[0]) * 2 +
        s->stack_size_max * sizeof(stack_buf[0]);
    s->state_stack = NULL;
    s->state_stack_len = 0;
    s->state_stack_size = 0;
    
    for(i = 0; i < s->capture_count * 2; i++)
        capture[i] = NULL;
    alloca_size = s->stack_size_max * sizeof(stack_buf[0]);
    stack_buf = alloca(alloca_size);
    ret = lre_exec_backtrack(s, capture, stack_buf, 0, bc_buf + RE_HEADER_LEN,
                             cbuf + (cindex << cbuf_type), FALSE);
    lre_realloc(s->opaque, s->state_stack, 0);
    return ret;
}